

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::SimpleAssignmentPatternExpression::forStruct
          (Compilation *comp,SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,
          Scope *structScope,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  size_t sVar4;
  EVP_PKEY_CTX *src;
  long in_RSI;
  ulong index_00;
  EVP_PKEY_CTX *in_RDI;
  const_iterator cVar5;
  SimpleAssignmentPatternExpression *result;
  Expression *expr;
  ExpressionSyntax *item;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2_1;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  uint32_t index;
  bool bad;
  ArgumentDirection direction;
  bool isLValue;
  Diagnostic *diag;
  FieldSymbol *field;
  specific_symbol_iterator<slang::ast::FieldSymbol> __end2;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *__range2;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  Expression *in_stack_fffffffffffffd68;
  Compilation *in_stack_fffffffffffffd70;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffffd78;
  Diagnostic *in_stack_fffffffffffffd80;
  ASTContext *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  undefined8 in_stack_fffffffffffffda0;
  DiagCode code;
  Expression *in_stack_fffffffffffffdb0;
  Type *in_stack_fffffffffffffdb8;
  Diagnostic *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  BumpAllocator *this;
  ParentList *local_228;
  ExpressionSyntax *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  Type *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  bitmask<slang::ast::VariableFlags> local_172;
  Expression *local_170;
  Diagnostic *local_168;
  const_iterator local_160;
  ASTContext *local_150;
  size_t local_148;
  long local_140;
  SmallVectorBase<const_slang::ast::Expression_*> local_138 [2];
  uint local_f4;
  byte local_ed;
  uint local_ec;
  bitmask<slang::ast::ASTFlags> local_e8;
  undefined1 local_dd;
  undefined4 local_dc;
  undefined4 local_c4;
  Diagnostic *local_c0;
  Type *local_b8;
  FieldSymbol *local_b0;
  Symbol *local_a8;
  Symbol *local_a0;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_88;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *local_78;
  SmallVectorBase<const_slang::ast::Type_*> local_70 [2];
  long local_18;
  EVP_PKEY_CTX *local_10;
  Compilation *local_8;
  ASTContext *context_00;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  SmallVector<const_slang::ast::Type_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Type_*,_5UL> *)0xedbeec);
  local_88 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)in_stack_fffffffffffffd80);
  local_78 = &local_88;
  local_a0 = (Symbol *)
             std::ranges::
             subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
             ::begin(local_78);
  local_a8 = (Symbol *)
             std::ranges::
             subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
             ::end(local_78);
  while( true ) {
    bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                      ((self_type *)in_stack_fffffffffffffd70,
                       (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                       in_stack_fffffffffffffd68);
    code = SUB84((ulong)in_stack_fffffffffffffda0 >> 0x20,0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_b0 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
               ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                            *)0xedbfc6);
    local_b8 = ValueSymbol::getType((ValueSymbol *)0xedbfed);
    SmallVectorBase<const_slang::ast::Type_*>::push_back
              ((SmallVectorBase<const_slang::ast::Type_*> *)in_stack_fffffffffffffd70,
               (Type **)in_stack_fffffffffffffd68);
    iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>::
    operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
              ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                *)in_stack_fffffffffffffd70);
  }
  sVar3 = SmallVectorBase<const_slang::ast::Type_*>::size(local_70);
  sVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                    ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xedc073);
  if (sVar3 == sVar4) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_e8,LValue);
    local_dd = bitmask<slang::ast::ASTFlags>::has
                         ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78);
    local_ec = (uint)(byte)local_dd;
    local_ed = 0;
    local_f4 = 0;
    SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xedc1fd);
    local_140 = local_18 + 0x28;
    cVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xedc21e);
    local_148 = cVar5.index;
    context_00 = (ASTContext *)cVar5.list;
    local_150 = context_00;
    cVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xedc25d);
    local_160 = cVar5;
    while( true ) {
      this = (BumpAllocator *)cVar5.index;
      local_228 = cVar5.list;
      uVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffd70,
                         (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)
                         in_stack_fffffffffffffd68);
      if (((uVar2 ^ 0xff) & 1) == 0) break;
      in_stack_fffffffffffffdc0 =
           (Diagnostic *)
           iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                        *)0xedc2ba);
      index_00 = (ulong)local_f4;
      local_f4 = local_f4 + 1;
      local_168 = in_stack_fffffffffffffdc0;
      in_stack_fffffffffffffdb8 =
           (Type *)SmallVectorBase<const_slang::ast::Type_*>::operator[](local_70,index_00);
      local_172.m_bits = 0;
      bitmask<slang::ast::VariableFlags>::bitmask(&local_172);
      in_stack_fffffffffffffdb0 =
           Expression::bindArgument
                     (in_stack_fffffffffffffe10,
                      (ArgumentDirection)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                      (bitmask<slang::ast::VariableFlags>)
                      (underlying_type)((ulong)in_stack_fffffffffffffe18 >> 0x30),
                      in_stack_fffffffffffffe00,context_00);
      local_170 = in_stack_fffffffffffffdb0;
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffd70,
                 (Expression **)in_stack_fffffffffffffd68);
      bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffd70);
      local_ed = (local_ed & 1) != 0 || bVar1;
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                  *)in_stack_fffffffffffffd70);
      cVar5.index = (size_t)this;
      cVar5.list = local_228;
    }
    SmallVectorBase<const_slang::ast::Expression_*>::copy(local_138,local_10,src);
    local_8 = (Compilation *)
              BumpAllocator::
              emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                        (this,(Type *)CONCAT17(uVar2,in_stack_fffffffffffffdc8),
                         (bool *)in_stack_fffffffffffffdc0,
                         (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                         in_stack_fffffffffffffdb8,(SourceRange *)in_stack_fffffffffffffdb0);
    if ((local_ed & 1) != 0) {
      local_8 = (Compilation *)Expression::badExpr(local_8,in_stack_fffffffffffffd68);
    }
    local_dc = 1;
    SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xedc4e7);
  }
  else {
    local_c4 = 0xae0007;
    sourceRange_00.endLoc._0_7_ = in_stack_fffffffffffffd98;
    sourceRange_00.startLoc = (SourceLocation)in_stack_fffffffffffffd90;
    sourceRange_00.endLoc._7_1_ = in_stack_fffffffffffffd9f;
    local_c0 = ASTContext::addDiag(in_stack_fffffffffffffd88,code,sourceRange_00);
    ast::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    SmallVectorBase<const_slang::ast::Type_*>::size(local_70);
    Diagnostic::operator<<<unsigned_long>
              (in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
    slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
              ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xedc13a);
    Diagnostic::operator<<<unsigned_long>
              (in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
    local_8 = (Compilation *)
              Expression::badExpr(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_dc = 1;
  }
  SmallVector<const_slang::ast::Type_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Type_*,_5UL> *)0xedc4f4);
  return (Expression *)local_8;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forStruct(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size()) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size();
        return badExpr(comp, nullptr);
    }

    const bool isLValue = context.flags.has(ASTFlags::LValue);
    auto direction = isLValue ? ArgumentDirection::Out : ArgumentDirection::In;

    bool bad = false;
    uint32_t index = 0;
    SmallVector<const Expression*> elems;
    for (auto item : syntax.items) {
        auto& expr = Expression::bindArgument(*types[index++], direction, {}, *item, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, isLValue, elems.copy(comp),
                                                                  sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}